

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::EvenOperator>
               (double *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        dVar12 = ldata[iVar6];
        if (0.0 <= dVar12) {
          dVar14 = ceil(dVar12);
          dVar12 = floor(dVar14 * 0.5);
          if ((dVar12 + dVar12 != dVar14) || (NAN(dVar12 + dVar12) || NAN(dVar14))) {
            dVar14 = dVar14 + 1.0;
          }
        }
        else {
          dVar12 = ceil(-dVar12);
          dVar14 = -dVar12;
          dVar13 = floor(dVar12 * -0.5);
          if ((dVar13 + dVar13 != dVar14) || (NAN(dVar13 + dVar13) || NAN(dVar14))) {
            dVar14 = -1.0 - dVar12;
          }
        }
        result_data[iVar6] = dVar14;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var4 = p_Stack_40;
      peVar3 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar7 = 0;
      uVar10 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar8 = count;
          }
LAB_006f4f10:
          uVar11 = uVar10;
          if (uVar10 < uVar8) {
            do {
              dVar12 = ldata[uVar10];
              if (0.0 <= dVar12) {
                dVar14 = ceil(dVar12);
                dVar12 = floor(dVar14 * 0.5);
                if ((dVar12 + dVar12 != dVar14) || (NAN(dVar12 + dVar12) || NAN(dVar14))) {
                  dVar14 = dVar14 + 1.0;
                }
              }
              else {
                dVar12 = ceil(-dVar12);
                dVar14 = -dVar12;
                dVar13 = floor(dVar12 * -0.5);
                if ((dVar13 + dVar13 != dVar14) || (NAN(dVar13 + dVar13) || NAN(dVar14))) {
                  dVar14 = -1.0 - dVar12;
                }
              }
              result_data[uVar10] = dVar14;
              uVar10 = uVar10 + 1;
              uVar11 = uVar8;
            } while (uVar8 != uVar10);
          }
        }
        else {
          uVar2 = puVar1[uVar7];
          uVar8 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar8 = count;
          }
          uVar11 = uVar8;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_006f4f10;
            uVar11 = uVar10;
            if (uVar10 < uVar8) {
              uVar9 = 0;
              do {
                if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
                  dVar12 = ldata[uVar10 + uVar9];
                  if (0.0 <= dVar12) {
                    dVar14 = ceil(dVar12);
                    dVar12 = floor(dVar14 * 0.5);
                    if ((dVar12 + dVar12 != dVar14) || (NAN(dVar12 + dVar12) || NAN(dVar14))) {
                      dVar14 = dVar14 + 1.0;
                    }
                  }
                  else {
                    dVar12 = ceil(-dVar12);
                    dVar14 = -dVar12;
                    dVar13 = floor(dVar12 * -0.5);
                    if ((dVar13 + dVar13 != dVar14) || (NAN(dVar13 + dVar13) || NAN(dVar14))) {
                      dVar14 = -1.0 - dVar12;
                    }
                  }
                  result_data[uVar10 + uVar9] = dVar14;
                }
                uVar9 = uVar9 + 1;
                uVar11 = uVar8;
              } while (uVar8 - uVar10 != uVar9);
            }
          }
        }
        uVar7 = uVar7 + 1;
        uVar10 = uVar11;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}